

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSAtom find_atom(JSContext *ctx,char *name)

{
  JSAtomStruct **ppJVar1;
  JSAtomStruct *pJVar2;
  int iVar3;
  JSAtom JVar4;
  size_t sVar5;
  ulong unaff_RBP;
  ulong uVar6;
  uint uVar7;
  bool bVar8;
  
  if (*name != '[') {
    sVar5 = strlen(name);
    JVar4 = JS_NewAtomLen(ctx,name,sVar5);
    return JVar4;
  }
  sVar5 = strlen(name + 1);
  uVar7 = (int)sVar5 - 1;
  ppJVar1 = ctx->rt->atom_array;
  uVar6 = 0xc5;
  while( true ) {
    pJVar2 = ppJVar1[uVar6];
    bVar8 = true;
    if ((*(uint *)&pJVar2->field_0x4 & 0x7fffffff) == uVar7) {
      iVar3 = bcmp(pJVar2 + 1,name + 1,(ulong)uVar7);
      bVar8 = iVar3 != 0;
      unaff_RBP = unaff_RBP & 0xffffffff;
      if (!bVar8) {
        unaff_RBP = uVar6 & 0xffffffff;
      }
    }
    if (!bVar8) break;
    uVar6 = uVar6 + 1;
    if (uVar6 == 0xd2) {
      abort();
    }
  }
  return (JSAtom)unaff_RBP;
}

Assistant:

static JSAtom find_atom(JSContext *ctx, const char *name)
{
    JSAtom atom;
    int len;

    if (*name == '[') {
        name++;
        len = strlen(name) - 1;
        /* We assume 8 bit non null strings, which is the case for these
           symbols */
        for(atom = JS_ATOM_Symbol_toPrimitive; atom < JS_ATOM_END; atom++) {
            JSAtomStruct *p = ctx->rt->atom_array[atom];
            JSString *str = p;
            if (str->len == len && !memcmp(str->u.str8, name, len))
                return JS_DupAtom(ctx, atom);
        }
        abort();
    } else {
        atom = JS_NewAtom(ctx, name);
    }
    return atom;
}